

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall re2::Prog::Flatten(Prog *this)

{
  size_t __n;
  uint uVar1;
  Inst *__s;
  int i;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer pIVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> flat;
  vector<int,_std::allocator<int>_> flatmap;
  vector<int,_std::allocator<int>_> stk;
  SparseSet q;
  SparseArray<int> rootmap;
  
  if (this->did_flatten_ == false) {
    this->did_flatten_ = true;
    SparseSet::SparseSet(&q,this->size_);
    stk.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    stk.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    stk.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::reserve(&stk,(long)this->size_);
    SparseArray<int>::SparseArray(&rootmap,this->size_);
    MarkRoots(this,&rootmap,&q,&stk);
    std::vector<int,_std::allocator<int>_>::vector
              (&flatmap,(long)rootmap.size_,(allocator_type *)&flat);
    flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::reserve(&flat,(long)this->size_)
    ;
    for (pIVar6 = rootmap.dense_.
                  super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar6 != rootmap.dense_.
                  super__Vector_base<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
                  ._M_impl.super__Vector_impl_data._M_start + rootmap.size_; pIVar6 = pIVar6 + 1) {
      flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [pIVar6->second] =
           (int)((ulong)((long)flat.
                               super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)flat.
                              super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
      EmitList(this,pIVar6->index_,&rootmap,&flat,&q,&stk);
      flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].out_opcode_ =
           flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].out_opcode_ | 8;
    }
    this->list_count_ =
         (int)((ulong)((long)flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2);
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      this->inst_count_[lVar2] = 0;
    }
    uVar9 = (ulong)((long)flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar5 = 0;
    iVar8 = (int)uVar9;
    uVar7 = 0;
    if (0 < iVar8) {
      uVar7 = uVar9 & 0xffffffff;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5].out_opcode_;
      uVar9 = 1;
      if ((uVar1 & 7) != 1) {
        flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5].out_opcode_ =
             uVar1 & 0xf |
             flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar1 >> 4] << 4;
        uVar9 = (ulong)(uVar1 & 7);
      }
      this->inst_count_[uVar9] = this->inst_count_[uVar9] + 1;
    }
    iVar3 = 0;
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      iVar3 = iVar3 + this->inst_count_[lVar2];
    }
    if (iVar3 != iVar8) {
      __assert_fail("(total) == (static_cast<int>(flat.size()))",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.cc",
                    0x1b0,"void re2::Prog::Flatten()");
    }
    iVar3 = this->start_unanchored_;
    if (iVar3 == 0) {
      if (this->start_ != 0) {
        __assert_fail("(start()) == (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.cc"
                      ,0x1b4,"void re2::Prog::Flatten()");
      }
    }
    else {
      iVar4 = flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[1];
      this->start_unanchored_ = iVar4;
      if (iVar3 != this->start_) {
        iVar4 = flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2];
      }
      this->start_ = iVar4;
    }
    this->size_ = iVar8;
    if (this->inst_ != (Inst *)0x0) {
      operator_delete__(this->inst_);
      iVar8 = this->size_;
    }
    __n = (long)iVar8 * 8;
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar8) {
      uVar5 = __n;
    }
    __s = (Inst *)operator_new__(uVar5);
    if (iVar8 != 0) {
      memset(__s,0,__n);
    }
    this->inst_ = __s;
    memmove(__s,flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
                super__Vector_impl_data._M_start,__n);
    std::_Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::~_Vector_base
              (&flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&flatmap.super__Vector_base<int,_std::allocator<int>_>);
    SparseArray<int>::~SparseArray(&rootmap);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&stk.super__Vector_base<int,_std::allocator<int>_>);
    SparseSet::~SparseSet(&q);
  }
  return;
}

Assistant:

void Prog::Flatten() {
  if (did_flatten_)
    return;
  did_flatten_ = true;

  // Scratch structures. It's important that these are reused by EmitList()
  // because we call it in a loop and it would thrash the heap otherwise.
  SparseSet q(size());
  vector<int> stk;
  stk.reserve(size());

  // First pass: Marks "roots".
  // Builds the mapping from inst-ids to root-ids.
  SparseArray<int> rootmap(size());
  MarkRoots(&rootmap, &q, &stk);

  // Second pass: Emits "lists". Remaps outs to root-ids.
  // Builds the mapping from root-ids to flat-ids.
  vector<int> flatmap(rootmap.size());
  vector<Inst> flat;
  flat.reserve(size());
  for (SparseArray<int>::const_iterator i = rootmap.begin();
       i != rootmap.end();
       ++i) {
    flatmap[i->value()] = static_cast<int>(flat.size());
    EmitList(i->index(), &rootmap, &flat, &q, &stk);
    flat.back().set_last();
  }

  list_count_ = static_cast<int>(flatmap.size());
  for (int i = 0; i < kNumInst; i++)
    inst_count_[i] = 0;

  // Third pass: Remaps outs to flat-ids.
  // Counts instructions by opcode.
  for (int id = 0; id < static_cast<int>(flat.size()); id++) {
    Inst* ip = &flat[id];
    if (ip->opcode() != kInstAltMatch)  // handled in EmitList()
      ip->set_out(flatmap[ip->out()]);
    inst_count_[ip->opcode()]++;
  }

  int total = 0;
  for (int i = 0; i < kNumInst; i++)
    total += inst_count_[i];
  DCHECK_EQ(total, static_cast<int>(flat.size()));

  // Remap start_unanchored and start.
  if (start_unanchored() == 0) {
    DCHECK_EQ(start(), 0);
  } else if (start_unanchored() == start()) {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[1]);
  } else {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[2]);
  }

  // Finally, replace the old instructions with the new instructions.
  size_ = static_cast<int>(flat.size());
  delete[] inst_;
  inst_ = new Inst[size_];
  memmove(inst_, flat.data(), size_ * sizeof *inst_);
}